

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestStatus *
vkt::compute::anon_unknown_0::EmptyShaderTest::createTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DeviceInterface *deviceInterface;
  VkDevice device_00;
  VkQueue queue_00;
  ProgramCollection<vk::ProgramBinary> *this;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar5;
  Handle<(vk::HandleType)14> *pHVar6;
  Handle<(vk::HandleType)24> *pHVar7;
  VkCommandBuffer_s **ppVVar8;
  Handle<(vk::HandleType)18> *pHVar9;
  allocator<char> local_2a1;
  string local_2a0;
  undefined1 local_27c [8];
  IVec3 workGroups;
  Move<vk::VkCommandBuffer_s_*> local_260;
  RefData<vk::VkCommandBuffer_s_*> local_240;
  undefined1 local_220 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_1e0;
  undefined1 local_1c0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> local_190;
  RefData<vk::Handle<(vk::HandleType)18>_> local_170;
  undefined1 local_150 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  RefData<vk::Handle<(vk::HandleType)16>_> local_110;
  undefined1 local_f0 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  allocator<char> local_b9;
  string local_b8;
  Move<vk::Handle<(vk::HandleType)14>_> local_98;
  RefData<vk::Handle<(vk::HandleType)14>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  deviceInterface = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex(context);
  this = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"comp",&local_b9);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this,&local_b8);
  ::vk::createShaderModule(&local_98,deviceInterface,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)
                     &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                      m_allocator,deviceInterface,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_110,
             (Move *)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                      m_allocator);
  data_00.deleter.m_deviceIface = local_110.deleter.m_deviceIface;
  data_00.object.m_internal = local_110.object.m_internal;
  data_00.deleter.m_device = local_110.deleter.m_device;
  data_00.deleter.m_allocator = local_110.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_f0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_f0);
  pipelineLayout_00.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_58);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar6->m_internal;
  makeComputePipeline(&local_190,deviceInterface,device_00,pipelineLayout_00,
                      (VkShaderModule)
                      cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_170,(Move *)&local_190);
  data_01.deleter.m_deviceIface = local_170.deleter.m_deviceIface;
  data_01.object.m_internal = local_170.object.m_internal;
  data_01.deleter.m_device = local_170.deleter.m_device;
  data_01.deleter.m_allocator = local_170.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_150,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_190);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                  deviceInterface,device_00,
                  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                  m_allocator._4_4_);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1e0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_02.deleter.m_deviceIface = local_1e0.deleter.m_deviceIface;
  data_02.object.m_internal = local_1e0.object.m_internal;
  data_02.deleter.m_device = local_1e0.deleter.m_device;
  data_02.deleter.m_allocator = local_1e0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1c0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_1c0);
  ::vk::allocateCommandBuffer
            (&local_260,deviceInterface,device_00,(VkCommandPool)pHVar7->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_240,(Move *)&local_260);
  data_03.deleter.m_deviceIface = local_240.deleter.m_deviceIface;
  data_03.object = local_240.object;
  data_03.deleter.m_device = local_240.deleter.m_device;
  data_03.deleter.m_pool.m_internal = local_240.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_220,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_260);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_220);
  beginCommandBuffer(deviceInterface,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_220);
  pVVar1 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_150);
  workGroups.m_data._4_8_ = pHVar9->m_internal;
  (*deviceInterface->_vptr_DeviceInterface[0x4c])(deviceInterface,pVVar1,1,workGroups.m_data._4_8_);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_27c,1,1,1);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_220);
  pVVar1 = *ppVVar8;
  uVar2 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_27c);
  uVar3 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_27c);
  uVar4 = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_27c);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])
            (deviceInterface,pVVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_220);
  endCommandBuffer(deviceInterface,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_220);
  submitCommandsAndWait(deviceInterface,device_00,queue_00,*ppVVar8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"Compute succeeded",&local_2a1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_220);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1c0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_150);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createTest (Context& context)
{
	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, context.getBinaryCollection().get("comp"), 0u));

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

	const tcu::IVec3 workGroups(1, 1, 1);
	vk.cmdDispatch(*cmdBuffer, workGroups.x(), workGroups.y(), workGroups.z());

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	return tcu::TestStatus::pass("Compute succeeded");
}